

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

bool __thiscall
llvm::sys::path::reverse_iterator::operator==(reverse_iterator *this,reverse_iterator *RHS)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if ((this->Path).Data != (RHS->Path).Data) {
    return false;
  }
  __n = (this->Component).Length;
  if (__n == (RHS->Component).Length) {
    if (__n != 0) {
      iVar1 = bcmp((this->Component).Data,(RHS->Component).Data,__n);
      if (iVar1 != 0) goto LAB_001493dd;
    }
    bVar2 = this->Position == RHS->Position;
  }
  else {
LAB_001493dd:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

iterator begin() const { return Data; }